

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O2

void google::protobuf::
     STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator**,std::vector<google::protobuf::compiler::objectivec::EnumGenerator*,std::allocator<google::protobuf::compiler::objectivec::EnumGenerator*>>>>
               (__normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
                begin,__normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
                      end)

{
  EnumGenerator *this;
  
  for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
    this = *begin._M_current;
    if (this != (EnumGenerator *)0x0) {
      compiler::objectivec::EnumGenerator::~EnumGenerator(this);
    }
    operator_delete(this,0x58);
  }
  return;
}

Assistant:

void STLDeleteContainerPointers(ForwardIterator begin,
                                ForwardIterator end) {
  while (begin != end) {
    ForwardIterator temp = begin;
    ++begin;
    delete *temp;
  }
}